

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O2

EC_T_BOOL CAtEmLogging::InitMsgBuffer
                    (MSG_BUFFER_DESC *pMsgBufferDesc,EC_T_DWORD dwMsgSize,EC_T_DWORD dwNumMsgs,
                    EC_T_BOOL bSkipDuplicates,EC_T_BOOL bPrintConsole,EC_T_BOOL bPrintTimestamp,
                    EC_T_CHAR *szMsgLogFileName,EC_T_CHAR *szMsgLogFileExt,EC_T_WORD wRollOver,
                    EC_T_CHAR *szBufferName)

{
  EC_T_CHAR *__dest;
  LOG_MSG_DESC *pLVar1;
  EC_T_CHAR *pEVar2;
  FILE *pFVar3;
  uint uVar4;
  long lVar5;
  EC_T_CHAR szfileNameTemp [256];
  
  memset(szfileNameTemp,0,0x100);
  pMsgBufferDesc->dwMsgSize = dwMsgSize;
  pMsgBufferDesc->dwNumMsgs = dwNumMsgs;
  pMsgBufferDesc->bPrintTimestamp = bPrintTimestamp;
  pMsgBufferDesc->bPrintConsole = bPrintConsole;
  pMsgBufferDesc->dwNextEmptyMsgIndex = 0;
  pMsgBufferDesc->dwNextPrintMsgIndex = 0;
  pMsgBufferDesc->wEntryCounter = 0;
  pMsgBufferDesc->pbyLogMemory = (EC_T_BYTE *)0x0;
  pMsgBufferDesc->pbyNextLogMsg = (EC_T_BYTE *)0x0;
  pMsgBufferDesc->dwLogMemorySize = 0;
  pMsgBufferDesc->bLogBufferFull = 0;
  pMsgBufferDesc->bSkipDuplicateMessages = bSkipDuplicates;
  pMsgBufferDesc->dwNumDuplicates = 0;
  pMsgBufferDesc->pszLastMsg = (EC_T_CHAR *)0x0;
  pLVar1 = (LOG_MSG_DESC *)calloc(1,(ulong)dwNumMsgs * 0x28);
  pMsgBufferDesc->paMsg = pLVar1;
  if (pLVar1 != (LOG_MSG_DESC *)0x0) {
    pEVar2 = (EC_T_CHAR *)calloc(1,(ulong)(dwNumMsgs * (dwMsgSize + 1)));
    if (pEVar2 != (EC_T_CHAR *)0x0) {
      pLVar1->szMsgBuffer = pEVar2;
      uVar4 = 0;
      for (lVar5 = 0; (ulong)dwNumMsgs * 0x28 - lVar5 != 0; lVar5 = lVar5 + 0x28) {
        *(EC_T_CHAR **)((long)&pLVar1->szMsgBuffer + lVar5) = pEVar2 + uVar4;
        *(undefined4 *)((long)&pLVar1->bMsgCrLf + lVar5) = 1;
        uVar4 = uVar4 + dwMsgSize + 1;
      }
      pMsgBufferDesc->wLogFileIndex = 0;
      pMsgBufferDesc->wEntryCounterLimit = wRollOver;
      pEVar2 = pMsgBufferDesc->szMsgLogFileName;
      strncpy(pEVar2,szMsgLogFileName,0xff);
      __dest = pMsgBufferDesc->szMsgLogFileExt;
      strncpy(__dest,szMsgLogFileExt,3);
      if (wRollOver == 0) {
        EcSnprintf(szfileNameTemp,0xff,"%s.%s",pEVar2,__dest);
      }
      else {
        EcSnprintf(szfileNameTemp,0xff,"%s.%x.%s",pEVar2,0,__dest);
      }
      if (bLogFileEnb == 0) {
        pMsgBufferDesc->pfMsgFile = (FILE *)0x0;
        pMsgBufferDesc->szMsgLogFileName[0] = '\0';
      }
      else {
        pFVar3 = fopen(szfileNameTemp,"w+");
        pMsgBufferDesc->pfMsgFile = (FILE *)pFVar3;
        if (pFVar3 == (FILE *)0x0) {
          printf("ERROR: cannot create EtherCAT log file %s\n",szfileNameTemp);
          LinuxSleep(3000);
        }
      }
      strncpy(pMsgBufferDesc->szLogName,szBufferName,0xff);
      pMsgBufferDesc->bIsInitialized = 1;
      return 1;
    }
  }
  printf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer \'%s\'\n",szBufferName);
  free(pMsgBufferDesc->paMsg);
  return 0;
}

Assistant:

EC_T_BOOL CAtEmLogging::InitMsgBuffer
(MSG_BUFFER_DESC*   pMsgBufferDesc      /* [in]  pointer to message buffer descriptor */
,EC_T_DWORD         dwMsgSize           /* [in]  size of a single message */
,EC_T_DWORD         dwNumMsgs           /* [in]  number of messages */
,EC_T_BOOL          bSkipDuplicates     /* [in]  EC_TRUE if duplicate messages shall be skipped */
,EC_T_BOOL          bPrintConsole       /* [in]  print message on console? */
,EC_T_BOOL          bPrintTimestamp     /* [in]  logging with time stamp? */
,EC_T_CHAR*         szMsgLogFileName    /* [in]  message log file name */
,EC_T_CHAR*         szMsgLogFileExt     /* [in]  message log file name */
,EC_T_WORD          wRollOver           /* [in]  roll over counter */
,EC_T_CHAR*         szBufferName        /* [in]  name of the logging buffer */
)
{
    EC_T_BOOL  bOk = EC_FALSE;
    EC_T_CHAR* pchMsgBuffer = EC_NULL;
    EC_T_DWORD dwBufSiz;
    EC_T_DWORD dwCnt;
#if (!(defined __RCX__) || (defined __MET__)) && !(defined RTAI)
    EC_T_CHAR  szfileNameTemp[MAX_PATH_LEN] = {0};
#endif

    pMsgBufferDesc->dwMsgSize = dwMsgSize;
    pMsgBufferDesc->dwNumMsgs = dwNumMsgs;
    pMsgBufferDesc->bPrintTimestamp = bPrintTimestamp;
    pMsgBufferDesc->bPrintConsole = bPrintConsole;
    pMsgBufferDesc->dwNextEmptyMsgIndex = 0;
    pMsgBufferDesc->dwNextPrintMsgIndex = 0;
    pMsgBufferDesc->wEntryCounter       = 0;
    pMsgBufferDesc->pbyLogMemory = EC_NULL;
    pMsgBufferDesc->dwLogMemorySize = 0;
    pMsgBufferDesc->pbyNextLogMsg = EC_NULL;
    pMsgBufferDesc->bLogBufferFull = EC_FALSE;
    pMsgBufferDesc->bSkipDuplicateMessages = bSkipDuplicates;
    pMsgBufferDesc->dwNumDuplicates = 0;
    pMsgBufferDesc->pszLastMsg = EC_NULL;

    pMsgBufferDesc->paMsg = (LOG_MSG_DESC*)OsMalloc(dwNumMsgs*sizeof(LOG_MSG_DESC));
    if (pMsgBufferDesc->paMsg == EC_NULL)
    {
        OsPrintf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer '%s'\n", szBufferName);
        goto Exit;
    }
    OsMemset(pMsgBufferDesc->paMsg, 0, dwNumMsgs*sizeof(LOG_MSG_DESC));

    dwBufSiz = dwNumMsgs * (dwMsgSize + 1);
    pchMsgBuffer = (EC_T_CHAR*)OsMalloc(dwBufSiz);
    if (pchMsgBuffer == EC_NULL)
    {
        OsPrintf("CAtEmLogging::InitMsgBuffer: cannot get memory for logging buffer '%s'\n", szBufferName);
        goto Exit;
    }

    /* Same as below. Needed to prevent false positive from static code analysis. */
    pMsgBufferDesc->paMsg[0].szMsgBuffer = pchMsgBuffer;

    OsMemset(pchMsgBuffer,0,dwBufSiz);
    for( dwCnt=0; dwCnt < dwNumMsgs; dwCnt++ )
    {
        pMsgBufferDesc->paMsg[dwCnt].szMsgBuffer = &pchMsgBuffer[dwCnt*(dwMsgSize+1)];
        pMsgBufferDesc->paMsg[dwCnt].bMsgCrLf = EC_TRUE;
    }

#if (defined __RCX__) || (defined __MET__) || (defined RTAI)
    pMsgBufferDesc->pfMsgFile = EC_NULL;
#else
    pMsgBufferDesc->wLogFileIndex    = 0;
    pMsgBufferDesc->wEntryCounterLimit = wRollOver;
    OsStrncpy(pMsgBufferDesc->szMsgLogFileName, szMsgLogFileName, sizeof(pMsgBufferDesc->szMsgLogFileName) - 1);
    OsStrncpy(pMsgBufferDesc->szMsgLogFileExt,  szMsgLogFileExt,  sizeof(pMsgBufferDesc->szMsgLogFileExt) - 1);

    if (0 != pMsgBufferDesc->wEntryCounterLimit )
    {
#ifdef FILESYS_8_3
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s_%x.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->wLogFileIndex, pMsgBufferDesc->szMsgLogFileExt);
#else
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s.%x.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->wLogFileIndex, pMsgBufferDesc->szMsgLogFileExt);
#endif
    }
    else
    {
        OsSnprintf(szfileNameTemp, sizeof(szfileNameTemp) - 1, "%s.%s", pMsgBufferDesc->szMsgLogFileName, pMsgBufferDesc->szMsgLogFileExt);
    }

    if (bLogFileEnb)
    {
        pMsgBufferDesc->pfMsgFile = OsFopen( szfileNameTemp, "w+" );
        if (pMsgBufferDesc->pfMsgFile == EC_NULL )
        {
#if !(defined NOPRINTF)
            OsPrintf( "ERROR: cannot create EtherCAT log file %s\n", szfileNameTemp );
#endif
            OsSleep(3000);
        }
    }
    else
    {
        pMsgBufferDesc->pfMsgFile = EC_NULL;
        pMsgBufferDesc->szMsgLogFileName[0] = 0;
    }
    OsStrncpy(pMsgBufferDesc->szLogName, szBufferName, MAX_PATH_LEN - 1);

#endif
    pMsgBufferDesc->bIsInitialized = EC_TRUE;
    bOk = EC_TRUE;

Exit:
    if (!bOk)
    {
        if (pMsgBufferDesc->paMsg!=EC_NULL)
        {
            OsFree(pMsgBufferDesc->paMsg);
        }
        if (pchMsgBuffer == EC_NULL)
        {
            OsFree(pchMsgBuffer);
        }
    }
    return bOk;
}